

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aVaryingInterpolationTests.cpp
# Opt level: O0

void deqp::gles3::Accuracy::renderReference
               (SurfaceAccess *dst,float *coords,Vec4 *wCoord,Vec3 *scale,Vec3 *bias)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_108;
  undefined1 local_f8 [8];
  Vec4 color;
  float b;
  float g;
  float r;
  float triNy;
  float triNx;
  int triNdx;
  float ny;
  float nx;
  float wy;
  float wx;
  int px;
  int py;
  Vec3 triW [2];
  undefined1 local_98 [8];
  Vec3 triB [2];
  undefined1 local_78 [8];
  Vec3 triG [2];
  undefined1 local_58 [8];
  Vec3 triR [2];
  float dstH;
  float dstW;
  Vec3 *bias_local;
  Vec3 *scale_local;
  Vec4 *wCoord_local;
  float *coords_local;
  SurfaceAccess *dst_local;
  
  iVar3 = tcu::SurfaceAccess::getWidth(dst);
  iVar4 = tcu::SurfaceAccess::getHeight(dst);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_58,*coords,coords[3],coords[6]);
  tcu::Vector<float,_3>::Vector
            ((Vector<float,_3> *)(triR[0].m_data + 1),coords[9],coords[6],coords[3]);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_78,coords[1],coords[4],coords[7]);
  tcu::Vector<float,_3>::Vector
            ((Vector<float,_3> *)(triG[0].m_data + 1),coords[10],coords[7],coords[4]);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_98,coords[2],coords[5],coords[8]);
  tcu::Vector<float,_3>::Vector
            ((Vector<float,_3> *)(triB[0].m_data + 1),coords[0xb],coords[8],coords[5]);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&px,(int)wCoord,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triW[0].m_data + 1),(int)wCoord,3,2);
  for (wx = 0.0; iVar5 = tcu::SurfaceAccess::getHeight(dst), (int)wx < iVar5;
      wx = (float)((int)wx + 1)) {
    for (wy = 0.0; iVar5 = tcu::SurfaceAccess::getWidth(dst), (int)wy < iVar5;
        wy = (float)((int)wy + 1)) {
      fVar8 = ((float)(int)wy + 0.5) / (float)iVar3;
      local_108 = ((float)(int)wx + 0.5) / (float)iVar4;
      uVar6 = (uint)(1.0 <= fVar8 + local_108);
      if (uVar6 != 0) {
        fVar8 = 1.0 - fVar8;
        local_108 = 1.0 - local_108;
      }
      fVar9 = projectedTriInterpolate
                        ((Vec3 *)(triR[(long)(int)uVar6 + -1].m_data + 1),
                         (Vec3 *)(&px + (long)(int)uVar6 * 3),fVar8,local_108);
      pfVar7 = tcu::Vector<float,_3>::operator[](scale,0);
      fVar1 = *pfVar7;
      pfVar7 = tcu::Vector<float,_3>::operator[](bias,0);
      fVar2 = *pfVar7;
      fVar10 = projectedTriInterpolate
                         ((Vec3 *)(triG[(long)(int)uVar6 + -1].m_data + 1),
                          (Vec3 *)(&px + (long)(int)uVar6 * 3),fVar8,local_108);
      pfVar7 = tcu::Vector<float,_3>::operator[](scale,1);
      fVar11 = *pfVar7;
      pfVar7 = tcu::Vector<float,_3>::operator[](bias,1);
      color.m_data[3] = fVar10 * fVar11 + *pfVar7;
      fVar11 = projectedTriInterpolate
                         ((Vec3 *)(triB[(long)(int)uVar6 + -1].m_data + 1),
                          (Vec3 *)(&px + (long)(int)uVar6 * 3),fVar8,local_108);
      pfVar7 = tcu::Vector<float,_3>::operator[](scale,2);
      fVar8 = *pfVar7;
      pfVar7 = tcu::Vector<float,_3>::operator[](bias,2);
      color.m_data[2] = fVar11 * fVar8 + *pfVar7;
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)local_f8,fVar9 * fVar1 + fVar2,color.m_data[3],color.m_data[2],
                 1.0);
      tcu::SurfaceAccess::setPixel(dst,(Vec4 *)local_f8,(int)wy,(int)wx);
    }
  }
  return;
}

Assistant:

static void renderReference (const SurfaceAccess& dst, const float coords[4*3], const Vec4& wCoord, const Vec3& scale, const Vec3& bias)
{
	float		dstW		= (float)dst.getWidth();
	float		dstH		= (float)dst.getHeight();

	Vec3		triR[2]		= { Vec3(coords[0*3+0], coords[1*3+0], coords[2*3+0]), Vec3(coords[3*3+0], coords[2*3+0], coords[1*3+0]) };
	Vec3		triG[2]		= { Vec3(coords[0*3+1], coords[1*3+1], coords[2*3+1]), Vec3(coords[3*3+1], coords[2*3+1], coords[1*3+1]) };
	Vec3		triB[2]		= { Vec3(coords[0*3+2], coords[1*3+2], coords[2*3+2]), Vec3(coords[3*3+2], coords[2*3+2], coords[1*3+2]) };
	tcu::Vec3	triW[2]		= { wCoord.swizzle(0, 1, 2), wCoord.swizzle(3, 2, 1) };

	for (int py = 0; py < dst.getHeight(); py++)
	{
		for (int px = 0; px < dst.getWidth(); px++)
		{
			float	wx		= (float)px + 0.5f;
			float	wy		= (float)py + 0.5f;
			float	nx		= wx / dstW;
			float	ny		= wy / dstH;

			int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
			float	triNx	= triNdx ? 1.0f - nx : nx;
			float	triNy	= triNdx ? 1.0f - ny : ny;

			float	r		= projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy) * scale[0] + bias[0];
			float	g		= projectedTriInterpolate(triG[triNdx], triW[triNdx], triNx, triNy) * scale[1] + bias[1];
			float	b		= projectedTriInterpolate(triB[triNdx], triW[triNdx], triNx, triNy) * scale[2] + bias[2];

			Vec4	color	= Vec4(r, g, b, 1.0f);

			dst.setPixel(color, px, py);
		}
	}
}